

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void __thiscall absl::lts_20250127::Mutex::Block(Mutex *this,PerThreadSynch *s)

{
  State SVar1;
  SynchWaitParams *pSVar2;
  bool bVar3;
  uint uVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  synchronization_internal *this_00;
  ThreadIdentity *identity;
  Mutex *mu;
  
  SVar1 = (s->state)._M_i;
  mu = this;
  identity = (ThreadIdentity *)s;
  while (SVar1 == kQueued) {
    identity = (ThreadIdentity *)s;
    bVar3 = DecrementSynchSem(mu,s,(KernelTimeout)(s->waitp->timeout).rep_);
    if (!bVar3) {
      TryRemove(this,s);
      if (s->next != (PerThreadSynch *)0x0) {
        this_00 = (synchronization_internal *)0x0;
        uVar5 = extraout_RDX;
        do {
          uVar4 = synchronization_internal::MutexDelay(this_00,1,(int)uVar5);
          this_00 = (synchronization_internal *)(ulong)uVar4;
          TryRemove(this,s);
          uVar5 = extraout_RDX_00;
        } while (s->next != (PerThreadSynch *)0x0);
      }
      identity = (ThreadIdentity *)s;
      mu = this;
      TryRemove(this,s);
      pSVar2 = s->waitp;
      (pSVar2->timeout).rep_ = 0xffffffffffffffff;
      pSVar2->cond = (Condition *)0x0;
    }
    SVar1 = (s->state)._M_i;
  }
  if ((s->waitp == (SynchWaitParams *)0x0) && (s->suppress_fatal_errors == false)) {
    Block();
    (identity->per_thread_synch).next = (PerThreadSynch *)0x0;
    (identity->per_thread_synch).state._M_i = kAvailable;
    AbslInternalPerThreadSemPost_lts_20250127(identity);
    return;
  }
  s->waitp = (SynchWaitParams *)0x0;
  return;
}

Assistant:

void Mutex::Block(PerThreadSynch* s) {
  while (s->state.load(std::memory_order_acquire) == PerThreadSynch::kQueued) {
    if (!DecrementSynchSem(this, s, s->waitp->timeout)) {
      // After a timeout, we go into a spin loop until we remove ourselves
      // from the queue, or someone else removes us.  We can't be sure to be
      // able to remove ourselves in a single lock acquisition because this
      // mutex may be held, and the holder has the right to read the centre
      // of the waiter queue without holding the spinlock.
      this->TryRemove(s);
      int c = 0;
      while (s->next != nullptr) {
        c = synchronization_internal::MutexDelay(c, GENTLE);
        this->TryRemove(s);
      }
      if (kDebugMode) {
        // This ensures that we test the case that TryRemove() is called when s
        // is not on the queue.
        this->TryRemove(s);
      }
      s->waitp->timeout = KernelTimeout::Never();  // timeout is satisfied
      s->waitp->cond = nullptr;  // condition no longer relevant for wakeups
    }
  }
  ABSL_RAW_CHECK(s->waitp != nullptr || s->suppress_fatal_errors,
                 "detected illegal recursion in Mutex code");
  s->waitp = nullptr;
}